

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  string local_40;
  
  switch(other) {
  case nullValue:
    bVar5 = isNumeric(this);
    if (bVar5) {
      dVar6 = asDouble(this);
      if ((dVar6 != 0.0) || (NAN(dVar6))) goto LAB_004a08b7;
LAB_004a08ca:
      bVar4 = true;
      bVar5 = false;
    }
    else {
LAB_004a08b7:
      bVar4 = true;
      if ((this->field_0x8 == '\x05') && ((this->value_).bool_ == false)) goto LAB_004a08ca;
      bVar5 = this->field_0x8 == '\x04';
      if (bVar5) {
        asString_abi_cxx11_(&local_40,this);
        iVar3 = std::__cxx11::string::compare((char *)&local_40);
        if (iVar3 != 0) goto LAB_004a08fb;
        bVar5 = true;
        bVar4 = true;
      }
      else {
LAB_004a08fb:
        cVar1 = (char)*(ushort *)&this->field_0x8;
        uVar2 = *(ushort *)&this->field_0x8 & 0xff;
        if (cVar1 == '\a') {
LAB_004a091c:
          if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)
          goto LAB_004a093a;
        }
        else if (cVar1 == '\x06') {
          if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)
          goto LAB_004a093a;
          if (uVar2 == 7) goto LAB_004a091c;
        }
        bVar4 = uVar2 == 0;
      }
    }
LAB_004a093a:
    if ((bVar5) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2)) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    goto LAB_004a08a7;
  case intValue:
    bVar5 = isInt(this);
    bVar4 = 1;
    if (bVar5) goto LAB_004a08a7;
    cVar1 = this->field_0x8;
    if ((cVar1 == '\x03') && (dVar6 = (this->value_).real_, -2147483648.0 <= dVar6)) {
      dVar7 = 2147483647.0;
LAB_004a085b:
      bVar4 = 1;
      if (dVar6 <= dVar7) goto LAB_004a08a7;
    }
    break;
  case uintValue:
    bVar5 = isUInt(this);
    bVar4 = 1;
    if (bVar5) goto LAB_004a08a7;
    cVar1 = this->field_0x8;
    if ((cVar1 == '\x03') && (dVar6 = (this->value_).real_, 0.0 <= dVar6)) {
      dVar7 = 4294967295.0;
      goto LAB_004a085b;
    }
    break;
  case realValue:
  case booleanValue:
    bVar5 = isNumeric(this);
    bVar4 = 1;
    if (bVar5) goto LAB_004a08a7;
    cVar1 = this->field_0x8;
    break;
  case stringValue:
    bVar5 = isNumeric(this);
    bVar4 = 1;
    if (!bVar5) {
      bVar4 = (byte)*(undefined2 *)&this->field_0x8;
      if (bVar4 < 6) {
        bVar4 = 0x31 >> (bVar4 & 0x1f);
      }
      else {
        bVar4 = 0;
      }
    }
    goto LAB_004a08a7;
  case arrayValue:
    cVar1 = this->field_0x8;
    bVar5 = cVar1 == '\x06';
    goto LAB_004a089c;
  case objectValue:
    cVar1 = this->field_0x8;
    bVar5 = cVar1 == '\a';
    goto LAB_004a089c;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                  ,0x2f1,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  bVar5 = cVar1 == '\x05';
LAB_004a089c:
  bVar4 = cVar1 == '\0' | bVar5;
LAB_004a08a7:
  return (bool)(bVar4 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type_ == booleanValue && value_.bool_ == false) ||
           (type_ == stringValue && asString() == "") ||
           (type_ == arrayValue && value_.map_->size() == 0) ||
           (type_ == objectValue && value_.map_->size() == 0) ||
           type_ == nullValue;
  case intValue:
    return isInt() ||
           (type_ == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case uintValue:
    return isUInt() ||
           (type_ == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case realValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case booleanValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case stringValue:
    return isNumeric() || type_ == booleanValue || type_ == stringValue ||
           type_ == nullValue;
  case arrayValue:
    return type_ == arrayValue || type_ == nullValue;
  case objectValue:
    return type_ == objectValue || type_ == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}